

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

void * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
allocate(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> *this
        ,size_type userSize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  size_type chunkSize;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  undefined4 extraout_var_01;
  MemChunk *pMVar7;
  SmallMemChunk *pSVar8;
  SmallMemChunk *pSVar9;
  undefined4 *puVar10;
  char cVar11;
  SmallMemChunk **ppSVar12;
  long lVar13;
  SmallMemChunk *chunk;
  CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *pCVar14;
  ulong uVar15;
  uint uVar16;
  ulong local_38;
  
  uVar15 = this->m_padding + userSize;
  local_38 = in_RAX;
  if (uVar15 < 0xe1) {
    uVar5 = 0x20;
    if (0xf < uVar15) {
      uVar5 = (ulong)((int)uVar15 + 0x1fU & 0x1f0);
    }
    bVar1 = (byte)(uVar5 >> 3);
    uVar16 = this->m_smallMap >> (bVar1 & 0x1f);
    if ((uVar16 & 3) == 0) {
      if (this->m_smallMap >> (bVar1 & 0x1f) == 0) goto LAB_00102821;
      uVar4 = 2 << (bVar1 & 0x1f);
      uVar4 = (-uVar4 | uVar4) & uVar16 << (bVar1 & 0x1f);
      uVar16 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      iVar3 = CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
              ::remove(this->m_smallLists + uVar16,(char *)userSize);
      pMVar7 = (MemChunk *)CONCAT44(extraout_var_00,iVar3);
      if (this->m_smallLists[uVar16].m_head == (SmallMemChunk *)0x0) {
        bVar1 = (byte)uVar16 & 0x1f;
        this->m_smallMap = this->m_smallMap & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      }
      if ((pMVar7 == (MemChunk *)0x0) ||
         (uVar15 = pMVar7->m_size & 0xfffffffffffffff0, uVar15 != uVar16 << 3)) goto LAB_001029f3;
      uVar6 = uVar15 - uVar5;
      if (0x1f < uVar6) {
        chunk = (SmallMemChunk *)((long)&pMVar7->m_prevFootSize + uVar5);
        pMVar7->m_size = uVar5;
        *(ulong *)((long)&pMVar7->m_prevFootSize + uVar5) = uVar5;
        *(ulong *)((long)&pMVar7->m_size + uVar5) = uVar6;
        *(ulong *)((long)&pMVar7->m_prevFootSize + uVar15) = uVar6;
        if (uVar6 < 0x100) {
          uVar16 = (uint)(uVar6 >> 3);
          pSVar9 = *(SmallMemChunk **)((long)this + uVar6 + 0x30);
          if (pSVar9 == (SmallMemChunk *)0x0) {
            ppSVar12 = (SmallMemChunk **)((long)this + uVar6 + 0x30);
            pSVar8 = chunk;
            pSVar9 = chunk;
          }
          else {
            pSVar8 = pSVar9->next;
            pSVar9->next = chunk;
            ppSVar12 = &pSVar8->prev;
          }
          *ppSVar12 = chunk;
          chunk->next = pSVar8;
          chunk->prev = pSVar9;
LAB_00102944:
          if ((this->m_smallMap >> (uVar16 & 0x1f) & 1) == 0) {
            this->m_smallMap = this->m_smallMap | 1 << ((byte)uVar16 & 0x1f);
          }
        }
        else {
LAB_0010290b:
          addLargeChunk(this,&chunk->super_MemChunk);
        }
      }
LAB_00102958:
      cVar11 = this->m_storingExactSize;
      uVar15 = pMVar7->m_size;
      uVar5 = uVar15 & 0xfffffffffffffff0;
    }
    else {
      uVar16 = (uVar16 & 1 | (uint)(uVar5 >> 3)) ^ 1;
      iVar3 = CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
              ::remove(this->m_smallLists + uVar16,(char *)userSize);
      pMVar7 = (MemChunk *)CONCAT44(extraout_var,iVar3);
      if (this->m_smallLists[uVar16].m_head == (SmallMemChunk *)0x0) {
        bVar1 = (byte)uVar16 & 0x1f;
        this->m_smallMap = this->m_smallMap & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      }
      if (pMVar7 == (MemChunk *)0x0) {
LAB_001029f3:
        puVar10 = (undefined4 *)__cxa_allocate_exception(0x10);
        *puVar10 = 1;
        *(char **)(puVar10 + 2) = "assertion failure.";
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      uVar15 = pMVar7->m_size;
      uVar5 = uVar15 & 0xfffffffffffffff0;
      if (uVar5 != uVar16 << 3) goto LAB_001029f3;
      cVar11 = this->m_storingExactSize;
    }
    pMVar7->m_size = uVar15 | 1;
    if ((cVar11 == '\x01') && (uVar5 != userSize + 0x10)) {
      pMVar7->m_size = uVar15 | 3;
      *(char *)((long)pMVar7 + (uVar5 - 1)) = (char)uVar5 - (char)(userSize + 0x10);
    }
    *(ulong *)((long)&pMVar7->m_prevFootSize + uVar5) = uVar5 | 1;
    if ((this->m_padding == true) &&
       (bVar1 = (((byte)(int)pMVar7->m_size & 0xf0) - (char)userSize) - 0x11, '\0' < (char)bVar1)) {
      bVar2 = 8;
      if (bVar1 < 8) {
        bVar2 = bVar1;
      }
      memset((void *)((long)&pMVar7[1].m_prevFootSize + userSize),(uint)(byte)this->m_paddingByte,
             (ulong)bVar2);
    }
    pMVar7 = pMVar7 + 1;
  }
  else {
    if (uVar15 < 0xffffffffffffff80) {
      uVar5 = uVar15 + 0x1f & 0xfffffffffffffff0;
LAB_00102821:
      if (this->m_treeMap != 0) {
        uVar16 = (uint)(uVar5 >> 8);
        if (uVar16 == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0x1f;
          if (uVar16 < 0x10000) {
            uVar4 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar15 = (ulong)((uint)((uVar5 >> ((ulong)(byte)(0x26 - (char)(uVar4 ^ 0x1f)) & 0x3f) &
                                    1) != 0) + (uVar4 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        lVar13 = uVar15 * 8 + 0x130;
        local_38 = uVar5;
        do {
          if (*(long *)((long)&((MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
                                 *)(this->m_smallLists + -6))->m_arena + lVar13) != 0) {
            iVar3 = PtrAVLTree::remove((PtrAVLTree *)
                                       ((long)&((MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
                                                 *)(this->m_smallLists + -6))->m_arena + lVar13),
                                       (char *)&local_38);
            pMVar7 = (MemChunk *)CONCAT44(extraout_var_01,iVar3);
            if (pMVar7 != (MemChunk *)0x0) {
              uVar15 = pMVar7->m_size & 0xfffffffffffffff0;
              uVar6 = uVar15 - uVar5;
              if (uVar6 < 0x20) goto LAB_00102958;
              chunk = (SmallMemChunk *)((long)&pMVar7->m_prevFootSize + uVar5);
              pMVar7->m_size = uVar5;
              *(ulong *)((long)&pMVar7->m_prevFootSize + uVar5) = uVar5;
              *(ulong *)((long)&pMVar7->m_size + uVar5) = uVar6;
              *(ulong *)((long)&pMVar7->m_prevFootSize + uVar15) = uVar6;
              if (0xff < uVar6) goto LAB_0010290b;
              uVar16 = (uint)(uVar6 >> 3) & 0x1e;
              pSVar9 = this->m_smallLists[uVar16].m_head;
              if (pSVar9 == (SmallMemChunk *)0x0) {
                pCVar14 = this->m_smallLists + uVar16;
                pSVar9 = chunk;
                pSVar8 = chunk;
              }
              else {
                pSVar8 = pSVar9->next;
                pSVar9->next = chunk;
                pCVar14 = (CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
                           *)&pSVar8->prev;
              }
              pCVar14->m_head = chunk;
              chunk->next = pSVar8;
              chunk->prev = pSVar9;
              goto LAB_00102944;
            }
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x230);
      }
      pMVar7 = arenaAlloc(this,uVar5);
      if (pMVar7 != (MemChunk *)0x0) goto LAB_00102958;
    }
    pMVar7 = (MemChunk *)0x0;
  }
  return pMVar7;
}

Assistant:

T*
    allocate (size_type userSize)
    {
        size_type  chunkSize;

        size_type allocSize = getMinAllocSize (userSize);

        if (allocSize < MIN_LARGE_REQUEST)
        {
            BinIndexType binIndex;
            BinIndexType smallBits;
            chunkSize = (allocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize (allocSize);
            binIndex = getSmallBinIndex (chunkSize);
            smallBits = m_smallMap >> binIndex;

            /*
             * Check if two smallest chunk lists that can satisfy the request.
             * Note that since the chunk is quite tight, it is not necessary
             * to split the chunk since there will not be enough rooms.
             */
            if ((smallBits & 0x3U) != 0)
            {
                MemChunk* chunk;
                binIndex += ~smallBits & 1; /* Uses next bin if idx empty */

                chunk = removeSmallChunkList (binIndex);
                COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize (binIndex));

                setUsed (chunk, userSize);

                return getUserPointer (chunk, userSize);
            }
            else
            {
                if (smallBits != 0)
                {
                    /* Use chunk in next nonempty smallbin */
                    MemChunk* chunk;
                    BinIndexType i;
                    BinIndexType leftbits = (smallBits << binIndex) & left_bits(idx2bit(binIndex));
                    BinIndexType leastbit = least_bit(leftbits);
                    cookmem_bit2treeIndex(leastbit, i);

                    chunk = removeSmallChunkList(i);
                    COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize(i));

                    chunk = splitChunk (chunk, chunkSize);

                    setUsed (chunk, userSize);

                    return getUserPointer (chunk, userSize);
                }
            }
        }
        else if (allocSize >= MAX_REQUEST)
        {
            // The request size is too big.
            m_logger.logAllocation (nullptr, userSize);
            return nullptr;
        }
        else
        {
            chunkSize = calcChunkSize (allocSize);
        }

        MemChunk* chunk;

        /*
         * Check if we have enough space in existing chunks.
         */
        if (m_treeMap != 0)
        {
            chunk = treeMalloc (chunkSize);
        }
        else
        {
            chunk = nullptr;
        }

        /*
         * At this point, we have to allocate memory from arena.
         */
        if (chunk == nullptr)
        {
            chunk = arenaAlloc (chunkSize);

            if (chunk == nullptr)
            {
                m_logger.logAllocation (nullptr, userSize);
                return nullptr;
            }
        }

        setUsed (chunk, userSize);

        return getUserPointer (chunk, userSize);
    }